

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O0

uint8_t __thiscall
Enterprise::ConcreteMachine<true,_false>::min_ram_slot
          (ConcreteMachine<true,_false> *this,Target *target)

{
  Model MVar1;
  char cVar2;
  size_t ram_size;
  Target *target_local;
  ConcreteMachine<true,_false> *this_local;
  
  cVar2 = '\b';
  MVar1 = target->model;
  if (MVar1 == Enterprise64) {
    cVar2 = '\x04';
  }
  else if (MVar1 == Enterprise128) {
    cVar2 = '\b';
  }
  else if (MVar1 == Enterprise256) {
    cVar2 = '\x10';
  }
  return -cVar2;
}

Assistant:

constexpr uint8_t min_ram_slot(const Analyser::Static::Enterprise::Target &target) {
			size_t ram_size = 128*1024;
			switch(target.model) {
				case Analyser::Static::Enterprise::Target::Model::Enterprise64:		ram_size = 64*1024;		break;
				case Analyser::Static::Enterprise::Target::Model::Enterprise128:	ram_size = 128*1024;	break;
				case Analyser::Static::Enterprise::Target::Model::Enterprise256:	ram_size = 256*1024;	break;
			}

			return uint8_t(0x100 - ram_size / 0x4000);
		}